

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O3

Vec_Ptr_t * Cec_ManPatPackPatterns(Vec_Int_t *vCexStore,int nInputs,int nRegs,int nWordsInit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p;
  int *piVar5;
  void **ppvVar6;
  void **ppvVar7;
  Vec_Ptr_t *vInfo;
  Vec_Ptr_t *vPres;
  long lVar8;
  void **ppvVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iWordStart;
  size_t __size;
  uint uVar14;
  int i;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  void **local_78;
  
  if (nInputs < nRegs) {
    __assert_fail("nRegs <= nInputs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecPat.c"
                  ,0x209,"Vec_Ptr_t *Cec_ManPatPackPatterns(Vec_Int_t *, int, int, int)");
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar5 = (int *)malloc(400);
  p->pArray = piVar5;
  lVar11 = (long)nWordsInit;
  lVar16 = (long)nInputs;
  __size = (lVar11 * 4 + 8) * lVar16;
  ppvVar6 = (void **)malloc(__size);
  uVar13 = (ulong)(uint)nInputs;
  if (0 < nInputs) {
    ppvVar7 = ppvVar6 + lVar16;
    ppvVar9 = ppvVar6;
    uVar12 = uVar13;
    do {
      *ppvVar9 = ppvVar7;
      ppvVar9 = ppvVar9 + 1;
      ppvVar7 = (void **)((long)ppvVar7 + lVar11 * 4);
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  vInfo = (Vec_Ptr_t *)malloc(0x10);
  vInfo->nSize = nInputs;
  vInfo->nCap = nInputs;
  vInfo->pArray = ppvVar6;
  if (0 < nInputs) {
    lVar17 = 0;
    do {
      memset(vInfo->pArray[lVar17],0,(long)(nWordsInit * 4));
      lVar17 = lVar17 + 1;
    } while (lVar17 < vInfo->nSize);
  }
  Gia_ManRandomInfo(vInfo,nRegs,0,nWordsInit);
  local_78 = (void **)malloc(__size);
  if (0 < nInputs) {
    ppvVar7 = local_78 + lVar16;
    ppvVar6 = local_78;
    uVar12 = uVar13;
    do {
      *ppvVar6 = ppvVar7;
      ppvVar6 = ppvVar6 + 1;
      ppvVar7 = (void **)((long)ppvVar7 + lVar11 * 4);
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  vPres = (Vec_Ptr_t *)malloc(0x10);
  vPres->nSize = nInputs;
  vPres->nCap = nInputs;
  vPres->pArray = local_78;
  if (0 < nInputs) {
    lVar11 = 0;
    do {
      memset(local_78[lVar11],0,(long)(nWordsInit * 4));
      lVar11 = lVar11 + 1;
    } while (lVar16 != lVar11);
  }
  iVar10 = 0;
  iVar2 = nWordsInit << 5;
  iWordStart = nWordsInit;
  do {
    do {
      iVar15 = iVar10;
      do {
        iVar4 = iVar15;
        if (vCexStore->nSize <= iVar4) {
          if (local_78 != (void **)0x0) {
            free(local_78);
          }
          free(vPres);
          if (p->pArray != (int *)0x0) {
            free(p->pArray);
          }
          free(p);
          return vInfo;
        }
        if ((iVar10 < -1) || (vCexStore->nSize <= (int)(iVar4 + 1U))) goto LAB_005b2b7b;
        iVar1 = vCexStore->pArray[iVar4 + 1U];
        iVar15 = iVar4 + 2;
      } while (iVar1 < 1);
      uVar14 = iVar4 + 2;
      p->nSize = 0;
      uVar12 = (ulong)uVar14;
      iVar10 = iVar1 + uVar14;
      iVar15 = 0;
      do {
        if (((int)uVar14 < 0) || (vCexStore->nSize <= iVar4 + 2 + iVar15)) {
LAB_005b2b7b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Vec_IntPush(p,vCexStore->pArray[uVar12]);
        iVar15 = iVar15 + 1;
        uVar12 = uVar12 + 1;
      } while (iVar1 != iVar15);
      iVar15 = 1;
      if (1 < iVar2) {
        piVar5 = p->pArray;
        iVar4 = p->nSize;
        iVar15 = 1;
        do {
          iVar3 = Cec_ManPatCollectTry(vInfo,vPres,iVar15,piVar5,iVar4);
          if (iVar3 != 0) break;
          iVar15 = iVar15 + 1 + (uint)((iVar15 + 1) % (nWordsInit << 5) == 0);
        } while (iVar15 < iVar2);
      }
    } while (iVar15 != iVar2 + -1);
    lVar11 = (long)vInfo->nSize;
    if (lVar11 < 2) {
LAB_005b2bd8:
      __assert_fail("Vec_PtrSize(vInfo) > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x434,"void Vec_PtrReallocSimInfo(Vec_Ptr_t *)");
    }
    iVar10 = iVar1 + uVar14;
    iVar15 = (int)((ulong)((long)vInfo->pArray[1] - (long)*vInfo->pArray) >> 2);
    lVar18 = (long)(iVar15 * 2);
    ppvVar6 = (void **)malloc((lVar18 * 4 + 8) * lVar11);
    lVar17 = lVar11 * 8;
    lVar8 = 0;
    do {
      ppvVar6[lVar8] = (void *)((long)ppvVar6 + lVar17);
      lVar8 = lVar8 + 1;
      lVar17 = lVar17 + lVar18 * 4;
    } while (lVar11 != lVar8);
    lVar17 = 0;
    do {
      if (lVar11 == lVar17) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      memcpy(ppvVar6[lVar17],vInfo->pArray[lVar17],(long)(iVar15 << 2));
      lVar17 = lVar17 + 1;
      iVar4 = vInfo->nSize;
    } while (lVar17 < iVar4);
    if (vInfo->pArray != (void **)0x0) {
      free(vInfo->pArray);
      iVar4 = vInfo->nSize;
    }
    vInfo->pArray = ppvVar6;
    if (0 < iVar4) {
      lVar11 = 0;
      do {
        memset((void *)((long)vInfo->pArray[lVar11] + (long)(iWordStart * 4)),0,
               (long)(iWordStart * 4));
        lVar11 = lVar11 + 1;
      } while (lVar11 < vInfo->nSize);
    }
    Gia_ManRandomInfo(vInfo,nRegs,iWordStart,iWordStart * 2);
    if (nInputs < 2) goto LAB_005b2bd8;
    iVar15 = (int)((ulong)((long)local_78[1] - (long)*local_78) >> 2);
    lVar17 = (long)(iVar15 * 2);
    ppvVar6 = (void **)malloc((lVar17 * 4 + 8) * uVar13);
    uVar12 = 0;
    lVar11 = uVar13 * 8;
    do {
      ppvVar6[uVar12] = (void *)((long)ppvVar6 + lVar11);
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + lVar17 * 4;
    } while (uVar13 != uVar12);
    lVar11 = 0;
    do {
      memcpy(ppvVar6[lVar11],local_78[lVar11],(long)(iVar15 << 2));
      lVar11 = lVar11 + 1;
    } while (lVar16 != lVar11);
    free(local_78);
    vPres->pArray = ppvVar6;
    lVar11 = 0;
    do {
      memset((void *)((long)ppvVar6[lVar11] + (long)(iWordStart << 2)),0,(long)(iWordStart << 2));
      lVar11 = lVar11 + 1;
    } while (lVar16 != lVar11);
    iVar2 = iVar2 * 2;
    local_78 = ppvVar6;
    iWordStart = iWordStart * 2;
  } while( true );
}

Assistant:

Vec_Ptr_t * Cec_ManPatPackPatterns( Vec_Int_t * vCexStore, int nInputs, int nRegs, int nWordsInit )
{
    Vec_Int_t * vPat;
    Vec_Ptr_t * vInfo, * vPres;
    int k, nSize, iStart, kMax = 0, nPatterns = 0;
    int nWords = nWordsInit;
    int nBits = 32 * nWords;
//    int RetValue;
    assert( nRegs <= nInputs );
    vPat  = Vec_IntAlloc( 100 );

    vInfo = Vec_PtrAllocSimInfo( nInputs, nWords );
    Vec_PtrCleanSimInfo( vInfo, 0, nWords );
    Gia_ManRandomInfo( vInfo, nRegs, 0, nWords );

    vPres = Vec_PtrAllocSimInfo( nInputs, nWords );
    Vec_PtrCleanSimInfo( vPres, 0, nWords );
    iStart = 0;
    while ( iStart < Vec_IntSize(vCexStore) )
    {
        nPatterns++;
        // skip the output number
        iStart++;
        // get the number of items
        nSize = Vec_IntEntry( vCexStore, iStart++ );
        if ( nSize <= 0 )
            continue;
        // extract pattern
        Vec_IntClear( vPat );
        for ( k = 0; k < nSize; k++ )
            Vec_IntPush( vPat, Vec_IntEntry( vCexStore, iStart++ ) );
        // add pattern to storage
        for ( k = 1; k < nBits; k++, k += ((k % (32 * nWordsInit)) == 0) )
            if ( Cec_ManPatCollectTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) ) )
                break;

//        k = kMax + 1;
//        RetValue = Cec_ManPatCollectTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) );
//        assert( RetValue == 1 );

        kMax = Abc_MaxInt( kMax, k );
        if ( k == nBits-1 )
        {
            Vec_PtrReallocSimInfo( vInfo );
            Vec_PtrCleanSimInfo( vInfo, nWords, 2*nWords );
            Gia_ManRandomInfo( vInfo, nRegs, nWords, 2*nWords );

            Vec_PtrReallocSimInfo( vPres );
            Vec_PtrCleanSimInfo( vPres, nWords, 2*nWords );
            nWords *= 2;
            nBits *= 2;
        }
    }
//    Abc_Print( 1, "packed %d patterns into %d vectors (out of %d)\n", nPatterns, kMax, nBits );
    Vec_PtrFree( vPres );
    Vec_IntFree( vPat );
    return vInfo;
}